

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O0

MQTTErrors mqtt_disconnect(mqtt_client *client)

{
  mqtt_queued_message *pmVar1;
  mqtt_queued_message *msg;
  ssize_t rv;
  mqtt_client *client_local;
  
  pthread_mutex_lock((pthread_mutex_t *)&client->mutex);
  if (client->error < 0) {
    pthread_mutex_unlock((pthread_mutex_t *)&client->mutex);
    client_local._4_4_ = client->error;
  }
  else {
    msg = (mqtt_queued_message *)mqtt_pack_disconnect((client->mq).curr,(client->mq).curr_sz);
    if ((long)msg < 0) {
      client_local._4_4_ = (MQTTErrors)msg;
      client->error = client_local._4_4_;
      pthread_mutex_unlock((pthread_mutex_t *)&client->mutex);
    }
    else {
      if (msg == (mqtt_queued_message *)0x0) {
        mqtt_mq_clean(&client->mq);
        msg = (mqtt_queued_message *)mqtt_pack_disconnect((client->mq).curr,(client->mq).curr_sz);
        if ((long)msg < 0) {
          client->error = (MQTTErrors)msg;
          pthread_mutex_unlock((pthread_mutex_t *)&client->mutex);
          return (MQTTErrors)msg;
        }
        if (msg == (mqtt_queued_message *)0x0) {
          client->error = MQTT_ERROR_SEND_BUFFER_IS_FULL;
          pthread_mutex_unlock((pthread_mutex_t *)&client->mutex);
          return MQTT_ERROR_SEND_BUFFER_IS_FULL;
        }
      }
      pmVar1 = mqtt_mq_register(&client->mq,(size_t)msg);
      pmVar1->control_type = MQTT_CONTROL_DISCONNECT;
      pthread_mutex_unlock((pthread_mutex_t *)&client->mutex);
      client_local._4_4_ = MQTT_OK;
    }
  }
  return client_local._4_4_;
}

Assistant:

enum MQTTErrors mqtt_disconnect(struct mqtt_client *client) 
{
    ssize_t rv;
    struct mqtt_queued_message *msg;
    MQTT_PAL_MUTEX_LOCK(&client->mutex);

    /* try to pack the message */
    MQTT_CLIENT_TRY_PACK(
        rv, msg, client, 
        mqtt_pack_disconnect(
            client->mq.curr, client->mq.curr_sz
        ), 
        1
    );
    /* save the control type and packet id of the message */
    msg->control_type = MQTT_CONTROL_DISCONNECT;

    MQTT_PAL_MUTEX_UNLOCK(&client->mutex);
    return MQTT_OK;
}